

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::ReverseTextureCoordinates(ON_Mesh *this,int dir)

{
  int iVar1;
  ON__UINT32 OVar2;
  uint uVar3;
  double dVar4;
  uint i;
  bool bVar5;
  bool bVar6;
  ON__UINT32 OVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  ON_2fPoint *pOVar11;
  long lVar12;
  ON_Interval tex_dom;
  ON_Interval local_48;
  
  if (1 < (uint)dir) {
    return false;
  }
  iVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if (iVar1 < 1) {
    return false;
  }
  if ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count != iVar1) {
    return false;
  }
  bVar5 = HasPackedTextureRegion(this);
  if (((this->m_Ttag).m_mapping_crc == 0) &&
     (bVar6 = ON_UuidIsNil(&(this->m_Ttag).m_mapping_id), bVar6)) {
    bVar6 = false;
LAB_0050a6ec:
    uVar3 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
    uVar10 = (ulong)uVar3;
    if ((!bVar6) && (bVar5)) {
      i = 1 - dir;
      if (this->m_packed_tex_rotate == false) {
        i = dir;
      }
      local_48.m_t[0] = this->m_srf_scale[(ulong)i * 2 + 2];
      local_48.m_t[1] = this->m_srf_scale[(ulong)i * 2 + 3];
      ON_Interval::Swap((ON_Interval *)(this->m_srf_scale + (ulong)i * 2 + 2));
      if (0 < (int)uVar3) {
        lVar12 = 0;
        do {
          pOVar11 = (ON_2fPoint *)
                    ((long)&((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x + lVar12);
          pfVar8 = ON_2fPoint::operator[](pOVar11,i);
          dVar4 = ON_Interval::NormalizedParameterAt(&local_48,(double)*pfVar8);
          dVar4 = ON_Interval::ParameterAt(&local_48,1.0 - dVar4);
          (&pOVar11->x)[i != 0] = (float)dVar4;
          lVar12 = lVar12 + 8;
        } while (uVar10 << 3 != lVar12);
      }
      goto LAB_0050a7f3;
    }
  }
  else {
    if ((this->m_Ttag).m_mapping_type == srfp_mapping) {
      OVar2 = (this->m_Ttag).m_mapping_crc;
      OVar7 = ON_TextureMapping::MappingCRC(&ON_TextureMapping::SurfaceParameterTextureMapping);
      bVar6 = OVar2 != OVar7;
      goto LAB_0050a6ec;
    }
    uVar10 = (ulong)(uint)(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
  }
  if (0 < (int)uVar10) {
    pOVar11 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
    uVar9 = 0;
    do {
      (&pOVar11[uVar9].x)[dir != 0] = 1.0 - (&pOVar11[uVar9].x)[dir != 0];
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
LAB_0050a7f3:
  InvalidateCachedTextureCoordinates(this,false);
  return true;
}

Assistant:

bool ON_Mesh::ReverseTextureCoordinates( int dir )
{
  if ( dir < 0 || dir > 1 || !HasTextureCoordinates() )
    return false;

  bool bPackedRegion =  HasPackedTextureRegion();

  bool bSrfParamTag = (!m_Ttag.IsSet() || m_Ttag.IsDefaultSurfaceParameterMapping());

  const int vcount = m_T.Count();
  int i;
  if ( bPackedRegion && bSrfParamTag )
  {
    // The region of the bitmap the texture uses 
    // cannot change.  The texture coordinates 
    // themselves get reflected in the subrectangle
    // about either the lowerleft to upperright
    // diagonal (llur = true) or the lowerright
    // to upperleft diagonal (llur = false).
    if ( m_packed_tex_rotate )
      dir = 1-dir;
    const ON_Interval tex_dom = m_packed_tex_domain[dir];
    double s;
    m_packed_tex_domain[dir].Swap(); // Swap() is correct - Reverse() is wrong.
    for (i = 0; i < vcount; i++ )
    {
      ON_2fPoint& tc = m_T[i];
      s = 1.0 - tex_dom.NormalizedParameterAt(tc[dir]);
      if ( dir )
        tc.y = (float)tex_dom.ParameterAt(s);
      else
        tc.x = (float)tex_dom.ParameterAt(s);
    }
  }
  else
  {
    for (i = 0; i < vcount; i++ )
    {
      ON_2fPoint& tc = m_T[i];
      if ( dir )
        tc.y = 1.0f-tc.y;
      else
        tc.x = 1.0f-tc.x;
    }
  }
  // 12 Jan 2024 - Jeff: https://mcneel.myjetbrains.com/youtrack/issue/RH-79611
  InvalidateCachedTextureCoordinates();
  return true;
}